

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  stbi_uc sVar3;
  short sVar4;
  uint uVar5;
  char cVar6;
  short sVar7;
  bool bVar8;
  int *piVar9;
  byte bVar10;
  uchar uVar11;
  short sVar12;
  int iVar13;
  stbi__uint32 sVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  stbi__jpeg *z;
  long lVar18;
  anon_struct_96_18_0d0905d3 *paVar19;
  void *pvVar20;
  code *pcVar21;
  void *pvVar22;
  undefined8 *puVar23;
  int iVar24;
  uint uVar25;
  char *pcVar26;
  long lVar27;
  undefined8 *puVar28;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar29;
  uint uVar30;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  int why_00;
  undefined8 extraout_RDX;
  undefined8 uVar31;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *extraout_RDX_03;
  anon_struct_96_18_0d0905d3 *extraout_RDX_04;
  anon_struct_96_18_0d0905d3 *paVar32;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  stbi_uc *extraout_RDX_15;
  stbi_uc *extraout_RDX_16;
  stbi_uc *psVar33;
  stbi_uc **ppsVar34;
  undefined1 *puVar35;
  byte *pbVar36;
  stbi__context *psVar37;
  ulong uVar38;
  ulong uVar39;
  stbi_uc *psVar40;
  long lVar41;
  ulong uVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  short *psVar46;
  long *in_FS_OFFSET;
  bool bVar47;
  undefined1 auVar48 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_1c8;
  ulong local_180;
  stbi_uc *local_158 [5];
  int local_130;
  int local_12c;
  int *local_128;
  anon_struct_96_18_0d0905d3 *local_120;
  stbi__uint32 *local_118;
  int *local_110;
  long local_108;
  stbi__uint32 *local_100;
  short local_f8 [4];
  long local_f0 [2];
  int local_e0 [44];
  
  local_100 = (stbi__uint32 *)x;
  z = (stbi__jpeg *)malloc(0x4888);
  if (z == (stbi__jpeg *)0x0) {
    *(char **)(*in_FS_OFFSET + -0x20) = "outofmem";
    return (void *)0x0;
  }
  memset(z,0,0x4888);
  z->s = s;
  z->idct_block_kernel = stbi__idct_simd;
  z->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  z->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  s->img_n = 0;
  if ((uint)req_comp < 5) {
    paVar1 = z->img_comp;
    lVar18 = 0x46d8;
    do {
      psVar33 = z->huff_dc[0].fast + lVar18 + -8;
      psVar33[0] = '\0';
      psVar33[1] = '\0';
      psVar33[2] = '\0';
      psVar33[3] = '\0';
      psVar33[4] = '\0';
      psVar33[5] = '\0';
      psVar33[6] = '\0';
      psVar33[7] = '\0';
      psVar33[8] = '\0';
      psVar33[9] = '\0';
      psVar33[10] = '\0';
      psVar33[0xb] = '\0';
      psVar33[0xc] = '\0';
      psVar33[0xd] = '\0';
      psVar33[0xe] = '\0';
      psVar33[0xf] = '\0';
      lVar18 = lVar18 + 0x60;
    } while (lVar18 != 0x4858);
    z->restart_interval = 0;
    local_118 = (stbi__uint32 *)y;
    local_110 = comp;
    iVar13 = stbi__decode_jpeg_header(z,0);
    uVar25 = extraout_EDX;
    if (iVar13 == 0) {
LAB_0013b0af:
      uVar29 = z->s->img_n;
    }
    else {
      bVar10 = stbi__get_marker(z);
      uVar29 = (uint)bVar10;
      puVar23 = (undefined8 *)(*in_FS_OFFSET + -0x20);
      local_128 = z->huff_ac[0].delta + 9;
      uVar31 = extraout_RDX;
LAB_00139176:
      uVar25 = (uint)uVar31;
      if (uVar29 == 0xda) {
        iVar13 = stbi__get16be(z->s);
        psVar37 = z->s;
        pbVar36 = psVar37->img_buffer;
        paVar32 = extraout_RDX_03;
        if (pbVar36 < psVar37->img_buffer_end) {
LAB_00139232:
          psVar37->img_buffer = pbVar36 + 1;
          bVar10 = *pbVar36;
        }
        else {
          if (psVar37->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar37);
            pbVar36 = psVar37->img_buffer;
            paVar32 = extraout_RDX_04;
            goto LAB_00139232;
          }
          bVar10 = 0;
        }
        z->scan_n = (uint)bVar10;
        if ((0xfb < (byte)(bVar10 - 5)) && ((int)(uint)bVar10 <= z->s->img_n)) {
          if (iVar13 != (uint)bVar10 * 2 + 6) {
            pcVar26 = "bad SOS len";
            goto LAB_0013b0a7;
          }
          if (bVar10 != 0) {
            lVar18 = 0;
            do {
              psVar37 = z->s;
              pbVar36 = psVar37->img_buffer;
              if (pbVar36 < psVar37->img_buffer_end) {
LAB_001392bb:
                psVar37->img_buffer = pbVar36 + 1;
                uVar29 = (uint)*pbVar36;
              }
              else {
                if (psVar37->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar37);
                  pbVar36 = psVar37->img_buffer;
                  goto LAB_001392bb;
                }
                uVar29 = 0;
              }
              psVar37 = z->s;
              pbVar36 = psVar37->img_buffer;
              if (pbVar36 < psVar37->img_buffer_end) {
LAB_001392ff:
                psVar37->img_buffer = pbVar36 + 1;
                bVar10 = *pbVar36;
              }
              else {
                if (psVar37->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar37);
                  pbVar36 = psVar37->img_buffer;
                  goto LAB_001392ff;
                }
                bVar10 = 0;
              }
              uVar25 = z->s->img_n;
              if ((int)uVar25 < 1) {
                uVar42 = 0;
              }
              else {
                uVar42 = 0;
                paVar32 = paVar1;
                do {
                  if (paVar32->id == uVar29) goto LAB_00139332;
                  uVar42 = uVar42 + 1;
                  paVar32 = paVar32 + 1;
                } while (uVar25 != uVar42);
                uVar42 = (ulong)uVar25;
              }
LAB_00139332:
              if ((uint)uVar42 == uVar25) goto LAB_0013b0af;
              uVar38 = uVar42 & 0xffffffff;
              paVar32 = (anon_struct_96_18_0d0905d3 *)(uVar38 * 0x60);
              z->img_comp[uVar38].hd = (uint)(bVar10 >> 4);
              if (0x3f < bVar10) {
                pcVar26 = "bad DC huff";
                goto LAB_0013b0a7;
              }
              paVar32 = paVar1 + uVar38;
              paVar32->ha = bVar10 & 0xf;
              if (3 < (bVar10 & 0xf)) {
                pcVar26 = "bad AC huff";
                goto LAB_0013b0a7;
              }
              z->order[lVar18] = (uint)uVar42;
              lVar18 = lVar18 + 1;
            } while (lVar18 < z->scan_n);
          }
          psVar37 = z->s;
          pbVar36 = psVar37->img_buffer;
          if (pbVar36 < psVar37->img_buffer_end) {
LAB_001393ed:
            psVar37->img_buffer = pbVar36 + 1;
            uVar25 = (uint)*pbVar36;
          }
          else {
            if (psVar37->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar37);
              pbVar36 = psVar37->img_buffer;
              goto LAB_001393ed;
            }
            uVar25 = 0;
          }
          z->spec_start = uVar25;
          psVar37 = z->s;
          pbVar36 = psVar37->img_buffer;
          if (pbVar36 < psVar37->img_buffer_end) {
LAB_00139438:
            psVar37->img_buffer = pbVar36 + 1;
            uVar25 = (uint)*pbVar36;
          }
          else {
            if (psVar37->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar37);
              pbVar36 = psVar37->img_buffer;
              goto LAB_00139438;
            }
            uVar25 = 0;
          }
          z->spec_end = uVar25;
          psVar37 = z->s;
          pbVar36 = psVar37->img_buffer;
          if (pbVar36 < psVar37->img_buffer_end) {
LAB_00139483:
            psVar37->img_buffer = pbVar36 + 1;
            bVar10 = *pbVar36;
          }
          else {
            if (psVar37->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar37);
              pbVar36 = psVar37->img_buffer;
              goto LAB_00139483;
            }
            bVar10 = 0;
          }
          z->succ_high = (uint)(bVar10 >> 4);
          uVar25 = bVar10 & 0xf;
          paVar32 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar25;
          z->succ_low = uVar25;
          iVar13 = z->progressive;
          iVar17 = z->spec_start;
          if (iVar13 == 0) {
            if (((iVar17 != 0) || (0xf < bVar10)) || ((bVar10 & 0xf) != 0)) goto LAB_0013a6bb;
            z->spec_end = 0x3f;
          }
          else if (((0x3f < iVar17) || (0x3f < z->spec_end)) ||
                  ((z->spec_end < iVar17 || ((0xdf < bVar10 || (0xd < uVar25)))))) {
LAB_0013a6bb:
            pcVar26 = "bad SOS";
            goto LAB_0013b0a7;
          }
          iVar17 = z->scan_n;
          uVar42 = (ulong)(uint)z->restart_interval;
          if (z->restart_interval == 0) {
            uVar42 = 0x7fffffff;
          }
          z->code_buffer = 0;
          z->code_bits = 0;
          z->nomore = 0;
          z->img_comp[3].dc_pred = 0;
          z->img_comp[2].dc_pred = 0;
          z->img_comp[1].dc_pred = 0;
          z->img_comp[0].dc_pred = 0;
          z->marker = 0xff;
          uVar25 = (uint)uVar42;
          z->todo = uVar25;
          z->eob_run = 0;
          if (iVar13 == 0) {
            if (iVar17 == 1) {
              iVar13 = z->order[0];
              iVar17 = z->img_comp[iVar13].y + 7 >> 3;
              if (0 < iVar17) {
                uVar29 = paVar1[iVar13].x + 7 >> 3;
                local_180 = (ulong)uVar29;
                iVar24 = 0;
                iVar44 = 0;
                do {
                  if (0 < (int)uVar29) {
                    lVar18 = 0;
                    do {
                      iVar15 = stbi__jpeg_decode_block
                                         (z,local_f8,z->huff_dc + paVar1[iVar13].hd,
                                          z->huff_ac + paVar1[iVar13].ha,
                                          z->fast_ac[paVar1[iVar13].ha],iVar13,
                                          z->dequant[paVar1[iVar13].tq]);
                      if (iVar15 == 0) {
                        bVar47 = false;
                        local_1c8 = 0;
                        uVar42 = extraout_RDX_07;
                      }
                      else {
                        (*z->idct_block_kernel)
                                  (paVar1[iVar13].data + lVar18 + iVar24 * paVar1[iVar13].w2,
                                   paVar1[iVar13].w2,local_f8);
                        iVar15 = z->todo;
                        z->todo = iVar15 + -1;
                        bVar47 = true;
                        uVar42 = extraout_RDX_08;
                        if (iVar15 < 2) {
                          if (z->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(z);
                            uVar42 = extraout_RDX_09;
                          }
                          if ((z->marker & 0xf8) == 0xd0) {
                            z->code_buffer = 0;
                            z->code_bits = 0;
                            z->nomore = 0;
                            z->img_comp[3].dc_pred = 0;
                            z->img_comp[2].dc_pred = 0;
                            z->img_comp[1].dc_pred = 0;
                            z->img_comp[0].dc_pred = 0;
                            z->marker = 0xff;
                            iVar15 = z->restart_interval;
                            uVar42 = 0x7fffffff;
                            if (iVar15 == 0) {
                              iVar15 = 0x7fffffff;
                            }
                            z->todo = iVar15;
                            z->eob_run = 0;
                          }
                          else {
                            local_1c8 = 1;
                            bVar47 = false;
                          }
                        }
                      }
                      uVar25 = (uint)uVar42;
                      iVar15 = local_1c8;
                      if (!bVar47) goto LAB_0013a553;
                      lVar18 = lVar18 + 8;
                    } while (local_180 * 8 != lVar18);
                  }
                  uVar25 = (uint)uVar42;
                  iVar44 = iVar44 + 1;
                  iVar24 = iVar24 + 8;
                } while (iVar44 != iVar17);
              }
            }
            else if (0 < z->img_mcu_y) {
              iVar13 = 0;
              do {
                if (0 < z->img_mcu_x) {
                  local_1c8 = 0;
                  do {
                    if (0 < z->scan_n) {
                      lVar18 = 0;
                      do {
                        iVar17 = z->order[lVar18];
                        if (0 < z->img_comp[iVar17].v) {
                          iVar44 = 0;
                          bVar47 = true;
                          do {
                            local_180 = CONCAT71(local_180._1_7_,bVar47);
                            iVar24 = paVar1[iVar17].h;
                            if (0 < iVar24) {
                              iVar15 = 0;
                              do {
                                iVar45 = paVar1[iVar17].v;
                                iVar16 = stbi__jpeg_decode_block
                                                   (z,local_f8,z->huff_dc + paVar1[iVar17].hd,
                                                    z->huff_ac + paVar1[iVar17].ha,
                                                    z->fast_ac[paVar1[iVar17].ha],iVar17,
                                                    z->dequant[paVar1[iVar17].tq]);
                                uVar25 = (uint)extraout_RDX_11;
                                if (iVar16 == 0) {
                                  uVar42 = extraout_RDX_11;
                                  if (bVar47 != false) goto LAB_0013a536;
                                  goto LAB_0013a43e;
                                }
                                (*z->idct_block_kernel)
                                          (paVar1[iVar17].data +
                                           (long)((iVar24 * local_1c8 + iVar15) * 8) +
                                           (long)((iVar45 * iVar13 + iVar44) * paVar1[iVar17].w2 * 8
                                                 ),paVar1[iVar17].w2,local_f8);
                                iVar15 = iVar15 + 1;
                                iVar24 = paVar1[iVar17].h;
                                uVar42 = extraout_RDX_12;
                              } while (iVar15 < iVar24);
                            }
                            iVar44 = iVar44 + 1;
                            bVar47 = iVar44 < paVar1[iVar17].v;
                          } while (iVar44 < paVar1[iVar17].v);
                        }
LAB_0013a43e:
                        lVar18 = lVar18 + 1;
                      } while (lVar18 < z->scan_n);
                    }
                    uVar25 = (uint)uVar42;
                    iVar17 = z->todo;
                    z->todo = iVar17 + -1;
                    if (iVar17 < 2) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                        uVar25 = extraout_EDX_02;
                      }
                      if ((z->marker & 0xf8) != 0xd0) goto LAB_0013a52f;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar17 = z->restart_interval;
                      uVar42 = 0x7fffffff;
                      if (iVar17 == 0) {
                        iVar17 = 0x7fffffff;
                      }
                      z->todo = iVar17;
                      z->eob_run = 0;
                    }
                    local_1c8 = local_1c8 + 1;
                  } while (local_1c8 < z->img_mcu_x);
                }
                uVar25 = (uint)uVar42;
                iVar13 = iVar13 + 1;
              } while (iVar13 < z->img_mcu_y);
            }
LAB_0013a52f:
            iVar15 = 1;
          }
          else {
            if (iVar17 == 1) {
              local_108 = (long)z->order[0];
              local_12c = z->img_comp[local_108].y + 7 >> 3;
              if (0 < local_12c) {
                paVar32 = paVar1 + local_108;
                local_130 = z->img_comp[local_108].x + 7 >> 3;
                iVar13 = 0;
                local_120 = paVar32;
                do {
                  if (0 < local_130) {
                    iVar17 = 0;
                    do {
                      local_1c8 = iVar17;
                      piVar9 = local_128;
                      psVar46 = paVar32->coeff + (paVar32->coeff_w * iVar13 + local_1c8) * 0x40;
                      uVar38 = (ulong)z->spec_start;
                      if (uVar38 == 0) {
                        iVar17 = stbi__jpeg_decode_block_prog_dc
                                           (z,psVar46,z->huff_dc + paVar32->hd,(int)local_108);
                        uVar42 = extraout_RDX_05;
                        if (iVar17 != 0) goto LAB_001397b2;
                        bVar47 = false;
                        local_180 = 0;
                      }
                      else {
                        lVar18 = (long)paVar32->ha;
                        iVar17 = z->eob_run;
                        bVar10 = (byte)z->succ_low;
                        if (z->succ_high == 0) {
                          if (iVar17 == 0) {
                            do {
                              if (z->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(z);
                              }
                              sVar12 = z->fast_ac[lVar18][z->code_buffer >> 0x17];
                              uVar25 = (uint)sVar12;
                              iVar17 = (int)uVar38;
                              if (sVar12 == 0) {
                                if (z->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(z);
                                }
                                uVar25 = z->code_buffer;
                                uVar42 = (ulong)z->huff_ac[lVar18].fast[uVar25 >> 0x17];
                                if (uVar42 == 0xff) {
                                  lVar27 = 0;
                                  do {
                                    lVar41 = lVar27;
                                    lVar27 = lVar41 + 1;
                                  } while ((uint)piVar9[lVar18 * 0x1a4 + lVar41 + -0x11] <=
                                           uVar25 >> 0x10);
                                  iVar44 = z->code_bits;
                                  if (lVar27 == 8) {
                                    z->code_bits = iVar44 + -0x10;
                                    uVar29 = 0xffffffff;
                                  }
                                  else {
                                    uVar29 = 0xffffffff;
                                    if (((int)(lVar41 + 10) <= iVar44) &&
                                       (uVar43 = (uVar25 >> (0x17U - (char)lVar27 & 0x1f) &
                                                 stbi__bmask[lVar41 + 10]) +
                                                 piVar9[lVar18 * 0x1a4 + lVar27], uVar43 < 0x100)) {
                                      z->code_bits = (iVar44 - (int)lVar27) + -9;
                                      z->code_buffer = uVar25 << ((byte)(lVar41 + 10) & 0x1f);
                                      uVar42 = (ulong)uVar43;
                                      goto LAB_00139cad;
                                    }
                                  }
                                }
                                else {
                                  bVar2 = z->huff_ac[lVar18].size[uVar42];
                                  uVar29 = 0xffffffff;
                                  if ((int)(uint)bVar2 <= z->code_bits) {
                                    z->code_buffer = uVar25 << (bVar2 & 0x1f);
                                    z->code_bits = z->code_bits - (uint)bVar2;
LAB_00139cad:
                                    uVar29 = (uint)z->huff_ac[lVar18].values[uVar42];
                                  }
                                }
                                if ((int)uVar29 < 0) {
                                  *puVar23 = "bad huffman code";
                                  iVar17 = 1;
                                  bVar47 = false;
                                }
                                else {
                                  uVar25 = uVar29 >> 4;
                                  uVar43 = uVar29 & 0xf;
                                  if (uVar43 == 0) {
                                    if (uVar29 < 0xf0) {
                                      z->eob_run = 1 << ((byte)uVar25 & 0x1f);
                                      if (0xf < uVar29) {
                                        if (z->code_bits < (int)uVar25) {
                                          stbi__grow_buffer_unsafe(z);
                                        }
                                        uVar29 = 0;
                                        if ((int)uVar25 <= z->code_bits) {
                                          bVar2 = (byte)uVar25 & 0x1f;
                                          uVar29 = z->code_buffer << bVar2 |
                                                   z->code_buffer >> 0x20 - bVar2;
                                          uVar43 = stbi__bmask[uVar25];
                                          z->code_buffer = ~uVar43 & uVar29;
                                          uVar29 = uVar29 & uVar43;
                                          z->code_bits = z->code_bits - uVar25;
                                        }
                                        z->eob_run = z->eob_run + uVar29;
                                      }
                                      z->eob_run = z->eob_run + -1;
                                      iVar17 = 2;
                                      goto LAB_00139c44;
                                    }
                                    uVar25 = iVar17 + 0x10;
                                  }
                                  else {
                                    bVar2 = ""[(long)iVar17 + (ulong)uVar25];
                                    if (z->code_bits < (int)uVar43) {
                                      stbi__grow_buffer_unsafe(z);
                                    }
                                    iVar44 = 0;
                                    if ((int)uVar43 <= z->code_bits) {
                                      uVar29 = z->code_buffer;
                                      uVar30 = uVar29 << (sbyte)uVar43 |
                                               uVar29 >> 0x20 - (sbyte)uVar43;
                                      uVar5 = *(uint *)((long)stbi__bmask + (ulong)(uVar43 << 2));
                                      z->code_buffer = ~uVar5 & uVar30;
                                      z->code_bits = z->code_bits - uVar43;
                                      iVar44 = 0;
                                      if (-1 < (int)uVar29) {
                                        iVar44 = *(int *)((long)stbi__jbias + (ulong)(uVar43 << 2));
                                      }
                                      iVar44 = (uVar30 & uVar5) + iVar44;
                                    }
                                    uVar25 = (int)((long)iVar17 + (ulong)uVar25) + 1;
                                    psVar46[bVar2] = (short)(iVar44 << (bVar10 & 0x1f));
                                  }
                                  uVar38 = (ulong)uVar25;
                                  iVar17 = 0;
                                  bVar47 = true;
                                }
                              }
                              else {
                                uVar43 = iVar17 + (uVar25 >> 4 & 0xf);
                                uVar38 = (ulong)uVar43;
                                uVar29 = uVar25 & 0xf;
                                if (z->code_bits < (int)uVar29) {
                                  *puVar23 = "bad huffman code";
                                  iVar17 = 1;
LAB_00139c44:
                                  bVar47 = false;
                                }
                                else {
                                  z->code_buffer = z->code_buffer << (sbyte)uVar29;
                                  z->code_bits = z->code_bits - uVar29;
                                  uVar38 = (ulong)(uVar43 + 1);
                                  psVar46[""[(int)uVar43]] =
                                       (short)((uVar25 >> 8) << (bVar10 & 0x1f));
                                  iVar17 = 0 << (bVar10 & 0x1f);
                                  bVar47 = true;
                                }
                              }
                              uVar42 = 0;
                              bVar8 = true;
                              if (iVar17 != 0) {
                                if (iVar17 != 2) {
                                  bVar8 = bVar47;
                                }
                                break;
                              }
                            } while ((int)uVar38 <= z->spec_end);
                          }
                          else {
                            z->eob_run = iVar17 + -1;
                            uVar42 = 1;
                            bVar8 = false;
                          }
                          if (bVar8) goto LAB_00139788;
                        }
                        else {
                          if (iVar17 == 0) {
                            iVar17 = 0x10000 << (bVar10 & 0x1f);
                            uVar25 = iVar17 >> 0x10;
                            do {
                              if (z->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(z);
                              }
                              uVar29 = z->code_buffer;
                              uVar42 = (ulong)z->huff_ac[lVar18].fast[uVar29 >> 0x17];
                              if (uVar42 == 0xff) {
                                lVar27 = 0;
                                do {
                                  lVar41 = lVar27;
                                  lVar27 = lVar41 + 1;
                                } while ((uint)piVar9[lVar18 * 0x1a4 + lVar41 + -0x11] <=
                                         uVar29 >> 0x10);
                                iVar44 = z->code_bits;
                                if (lVar27 == 8) {
                                  z->code_bits = iVar44 + -0x10;
                                  uVar39 = 0xffffffff;
                                }
                                else {
                                  uVar39 = 0xffffffff;
                                  if (((int)(lVar41 + 10) <= iVar44) &&
                                     (uVar43 = (uVar29 >> (0x17U - (char)lVar27 & 0x1f) &
                                               stbi__bmask[lVar41 + 10]) +
                                               piVar9[lVar18 * 0x1a4 + lVar27], uVar43 < 0x100)) {
                                    z->code_bits = (iVar44 - (int)lVar27) + -9;
                                    z->code_buffer = uVar29 << ((byte)(lVar41 + 10) & 0x1f);
                                    uVar42 = (ulong)uVar43;
                                    goto LAB_00139909;
                                  }
                                }
                              }
                              else {
                                bVar10 = z->huff_ac[lVar18].size[uVar42];
                                uVar39 = 0xffffffff;
                                if ((int)(uint)bVar10 <= z->code_bits) {
                                  z->code_buffer = uVar29 << (bVar10 & 0x1f);
                                  z->code_bits = z->code_bits - (uint)bVar10;
LAB_00139909:
                                  uVar39 = (ulong)z->huff_ac[lVar18].values[uVar42];
                                }
                              }
                              uVar29 = (uint)uVar39;
                              if ((int)uVar29 < 0) {
                                *puVar23 = "bad huffman code";
                                bVar47 = false;
                              }
                              else {
                                uVar42 = uVar39 >> 4;
                                if ((uVar29 & 0xf) == 1) {
                                  if (z->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(z);
                                  }
                                  uVar29 = -uVar25;
                                  if (0 < z->code_bits) {
                                    sVar14 = z->code_buffer;
                                    z->code_buffer = sVar14 * 2;
                                    z->code_bits = z->code_bits + -1;
                                    if ((int)sVar14 < 0) {
                                      uVar29 = uVar25;
                                    }
                                  }
                                  sVar12 = (short)uVar29;
                                  uVar39 = uVar42;
                                }
                                else {
                                  if ((uVar39 & 0xf) != 0) {
                                    *puVar23 = "bad huffman code";
                                    bVar47 = false;
                                    goto LAB_00139b8a;
                                  }
                                  sVar12 = 0;
                                  uVar39 = 0xf;
                                  if (uVar29 < 0xf0) {
                                    iVar44 = (int)uVar42;
                                    z->eob_run = ~(-1 << ((byte)uVar42 & 0x1f));
                                    uVar39 = 0x40;
                                    sVar12 = 0;
                                    if (0xf < uVar29) {
                                      if (z->code_bits < iVar44) {
                                        stbi__grow_buffer_unsafe(z);
                                      }
                                      sVar12 = 0;
                                      uVar29 = 0;
                                      if (iVar44 <= z->code_bits) {
                                        bVar10 = (byte)uVar42 & 0x1f;
                                        uVar29 = z->code_buffer << bVar10 |
                                                 z->code_buffer >> 0x20 - bVar10;
                                        uVar43 = stbi__bmask[uVar42];
                                        z->code_buffer = ~uVar43 & uVar29;
                                        uVar29 = uVar29 & uVar43;
                                        z->code_bits = z->code_bits - iVar44;
                                      }
                                      z->eob_run = z->eob_run + uVar29;
                                    }
                                  }
                                }
                                uVar38 = (ulong)(int)uVar38;
                                do {
                                  if ((long)z->spec_end < (long)uVar38) break;
                                  bVar10 = ""[uVar38];
                                  if (psVar46[bVar10] == 0) {
                                    if ((int)uVar39 == 0) {
                                      psVar46[bVar10] = sVar12;
                                      bVar47 = false;
                                      uVar39 = 0;
                                    }
                                    else {
                                      uVar39 = (ulong)((int)uVar39 - 1);
                                      bVar47 = true;
                                    }
                                  }
                                  else {
                                    if (z->code_bits < 1) {
                                      stbi__grow_buffer_unsafe(z);
                                    }
                                    bVar47 = true;
                                    if (0 < z->code_bits) {
                                      sVar14 = z->code_buffer;
                                      z->code_buffer = sVar14 * 2;
                                      z->code_bits = z->code_bits + -1;
                                      if (((int)sVar14 < 0) &&
                                         (sVar4 = psVar46[bVar10], (uVar25 & (int)sVar4) == 0)) {
                                        sVar7 = (short)((uint)iVar17 >> 0x10);
                                        if (sVar4 < 1) {
                                          sVar7 = -sVar7;
                                        }
                                        psVar46[bVar10] = sVar4 + sVar7;
                                      }
                                    }
                                  }
                                  uVar38 = uVar38 + 1;
                                } while (bVar47);
                                bVar47 = true;
                              }
LAB_00139b8a:
                              if (!bVar47) {
                                uVar42 = 0;
                                goto LAB_0013978d;
                              }
                            } while ((int)uVar38 <= z->spec_end);
                          }
                          else {
                            z->eob_run = iVar17 + -1;
                            if (z->spec_start <= z->spec_end) {
                              uVar25 = (0x10000 << (bVar10 & 0x1f)) >> 0x10;
                              do {
                                bVar10 = ""[uVar38];
                                if (psVar46[bVar10] != 0) {
                                  if (z->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(z);
                                  }
                                  if (0 < z->code_bits) {
                                    sVar14 = z->code_buffer;
                                    z->code_buffer = sVar14 * 2;
                                    z->code_bits = z->code_bits + -1;
                                    if (((int)sVar14 < 0) &&
                                       (sVar12 = psVar46[bVar10], (uVar25 & (int)sVar12) == 0)) {
                                      uVar29 = -uVar25;
                                      if (0 < sVar12) {
                                        uVar29 = uVar25;
                                      }
                                      psVar46[bVar10] = (short)uVar29 + sVar12;
                                    }
                                  }
                                }
                                bVar47 = (long)uVar38 < (long)z->spec_end;
                                uVar38 = uVar38 + 1;
                              } while (bVar47);
                            }
                          }
LAB_00139788:
                          uVar42 = 1;
                        }
LAB_0013978d:
                        bVar47 = (int)uVar42 == 0;
                        if (bVar47) {
                          local_180._0_4_ = 0;
                        }
                        local_180 = (ulong)(uint)local_180;
                        paVar32 = local_120;
                        if (bVar47) {
                          bVar47 = false;
                        }
                        else {
LAB_001397b2:
                          iVar17 = z->todo;
                          z->todo = iVar17 + -1;
                          bVar47 = true;
                          if (iVar17 < 2) {
                            if (z->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(z);
                              uVar42 = extraout_RDX_06;
                            }
                            if ((z->marker & 0xf8) == 0xd0) {
                              z->code_buffer = 0;
                              z->code_bits = 0;
                              z->nomore = 0;
                              z->img_comp[3].dc_pred = 0;
                              z->img_comp[2].dc_pred = 0;
                              z->img_comp[1].dc_pred = 0;
                              z->img_comp[0].dc_pred = 0;
                              z->marker = 0xff;
                              iVar17 = z->restart_interval;
                              uVar42 = 0x7fffffff;
                              if (iVar17 == 0) {
                                iVar17 = 0x7fffffff;
                              }
                              z->todo = iVar17;
                              z->eob_run = 0;
                            }
                            else {
                              local_180 = 1;
                              bVar47 = false;
                            }
                          }
                        }
                      }
                      uVar25 = (uint)uVar42;
                      if (!bVar47) {
                        iVar15 = (uint)local_180;
                        goto LAB_0013a553;
                      }
                      iVar17 = local_1c8 + 1;
                    } while (local_1c8 + 1 != local_130);
                  }
                  uVar25 = (uint)uVar42;
                  iVar13 = iVar13 + 1;
                } while (iVar13 != local_12c);
              }
              goto LAB_0013a52f;
            }
            iVar15 = 1;
            if (0 < z->img_mcu_y) {
              iVar13 = 0;
              do {
                if (0 < z->img_mcu_x) {
                  iVar17 = 0;
                  do {
                    if (0 < z->scan_n) {
                      lVar18 = 0;
                      do {
                        iVar44 = z->order[lVar18];
                        if (0 < z->img_comp[iVar44].v) {
                          iVar24 = 0;
                          bVar47 = true;
                          do {
                            iVar15 = paVar1[iVar44].h;
                            if (0 < iVar15) {
                              iVar45 = 0;
                              do {
                                iVar15 = stbi__jpeg_decode_block_prog_dc
                                                   (z,paVar1[iVar44].coeff +
                                                      (iVar15 * iVar17 + iVar45 +
                                                      (paVar1[iVar44].v * iVar13 + iVar24) *
                                                      paVar1[iVar44].coeff_w) * 0x40,
                                                    z->huff_dc + paVar1[iVar44].hd,iVar44);
                                uVar25 = (uint)extraout_RDX_10;
                                uVar42 = extraout_RDX_10;
                                if (iVar15 == 0) {
                                  if (bVar47) goto LAB_0013a536;
                                  goto LAB_0013a1fc;
                                }
                                iVar45 = iVar45 + 1;
                                iVar15 = paVar1[iVar44].h;
                              } while (iVar45 < iVar15);
                            }
                            iVar24 = iVar24 + 1;
                            bVar47 = iVar24 < paVar1[iVar44].v;
                          } while (iVar24 < paVar1[iVar44].v);
                        }
LAB_0013a1fc:
                        lVar18 = lVar18 + 1;
                      } while (lVar18 < z->scan_n);
                    }
                    uVar25 = (uint)uVar42;
                    iVar44 = z->todo;
                    z->todo = iVar44 + -1;
                    if (iVar44 < 2) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                        uVar25 = extraout_EDX_01;
                      }
                      iVar15 = 1;
                      if ((z->marker & 0xf8) != 0xd0) goto LAB_0013a553;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar44 = z->restart_interval;
                      uVar42 = 0x7fffffff;
                      if (iVar44 == 0) {
                        iVar44 = 0x7fffffff;
                      }
                      z->todo = iVar44;
                      z->eob_run = 0;
                    }
                    iVar17 = iVar17 + 1;
                  } while (iVar17 < z->img_mcu_x);
                }
                uVar25 = (uint)uVar42;
                iVar15 = 1;
                iVar13 = iVar13 + 1;
              } while (iVar13 < z->img_mcu_y);
            }
          }
          goto LAB_0013a553;
        }
        pcVar26 = "bad SOS component count";
LAB_0013b0a7:
        uVar25 = (uint)paVar32;
        *puVar23 = pcVar26;
        goto LAB_0013b0af;
      }
      if (uVar29 == 0xdc) goto LAB_001391b6;
      if (uVar29 == 0xd9) {
        if ((z->progressive != 0) && (0 < z->s->img_n)) {
          lVar18 = 0;
          do {
            iVar13 = z->img_comp[lVar18].y + 7 >> 3;
            if (0 < iVar13) {
              uVar25 = paVar1[lVar18].x + 7 >> 3;
              iVar17 = 0;
              do {
                if (0 < (int)uVar25) {
                  uVar42 = 0;
                  do {
                    psVar46 = paVar1[lVar18].coeff +
                              (paVar1[lVar18].coeff_w * iVar17 + (int)uVar42) * 0x40;
                    iVar44 = paVar1[lVar18].tq;
                    lVar27 = 0;
                    do {
                      psVar46[lVar27] = psVar46[lVar27] * z->dequant[iVar44][lVar27];
                      lVar27 = lVar27 + 1;
                    } while (lVar27 != 0x40);
                    (*z->idct_block_kernel)
                              (paVar1[lVar18].data +
                               uVar42 * 8 + (long)(iVar17 * 8 * paVar1[lVar18].w2),paVar1[lVar18].w2
                               ,psVar46);
                    uVar42 = uVar42 + 1;
                    uVar31 = extraout_RDX_14;
                  } while (uVar42 != uVar25);
                }
                iVar17 = iVar17 + 1;
              } while (iVar17 != iVar13);
            }
            uVar25 = (uint)uVar31;
            lVar18 = lVar18 + 1;
          } while (lVar18 < z->s->img_n);
        }
      }
      else {
        iVar13 = stbi__process_marker(z,uVar29);
        uVar25 = extraout_EDX_00;
        if (iVar13 != 0) goto LAB_001391a8;
      }
      if (req_comp == 0) {
        req_comp = (uint)(2 < z->s->img_n) * 2 + 1;
      }
      uVar29 = z->s->img_n;
      if (uVar29 == 3) {
        bVar47 = true;
        if (z->rgb != 3) {
          if (z->app14_color_transform != 0) goto LAB_0013a7fc;
          bVar47 = z->jfif == 0;
        }
      }
      else {
LAB_0013a7fc:
        bVar47 = false;
      }
      uVar43 = 1;
      if (bVar47) {
        uVar43 = uVar29;
      }
      if (2 < req_comp) {
        uVar43 = uVar29;
      }
      if (uVar29 != 3) {
        uVar43 = uVar29;
      }
      if (0 < (int)uVar43) {
        local_158[2] = (stbi_uc *)0x0;
        local_158[3] = (stbi_uc *)0x0;
        local_158[0] = (stbi_uc *)0x0;
        local_158[1] = (stbi_uc *)0x0;
        pvVar22 = (void *)0x0;
        lVar18 = 0;
        do {
          psVar37 = z->s;
          sVar14 = psVar37->img_x;
          pvVar20 = malloc((ulong)(sVar14 + 3));
          *(void **)((long)&z->img_comp[0].linebuf + lVar18 * 2) = pvVar20;
          if (pvVar20 == (void *)0x0) {
            stbi__free_jpeg_components(z,psVar37->img_n,why);
            *puVar23 = "outofmem";
          }
          else {
            uVar42 = (long)z->img_h_max / (long)*(int *)((long)&z->img_comp[0].h + lVar18 * 2);
            iVar13 = (int)uVar42;
            *(int *)((long)local_e0 + lVar18) = iVar13;
            iVar17 = z->img_v_max / *(int *)((long)&z->img_comp[0].v + lVar18 * 2);
            *(int *)((long)local_e0 + lVar18 + 4) = iVar17;
            *(int *)((long)local_e0 + lVar18 + 0xc) = iVar17 >> 1;
            *(int *)((long)local_e0 + lVar18 + 8) =
                 (int)((ulong)((sVar14 + iVar13) - 1) / (uVar42 & 0xffffffff));
            *(undefined4 *)((long)local_e0 + lVar18 + 0x10) = 0;
            uVar31 = *(undefined8 *)((long)&z->img_comp[0].data + lVar18 * 2);
            *(undefined8 *)((long)local_f0 + lVar18 + 8) = uVar31;
            *(undefined8 *)((long)local_f0 + lVar18) = uVar31;
            if ((iVar13 == 1) && (iVar17 == 1)) {
              *(code **)((long)local_f8 + lVar18) = resample_row_1;
            }
            else {
              if ((iVar13 == 1) && (iVar17 == 2)) {
                pcVar21 = stbi__resample_row_v_2;
              }
              else if ((iVar13 == 2) && (iVar17 == 1)) {
                pcVar21 = stbi__resample_row_h_2;
              }
              else if ((iVar13 == 2) && (iVar17 == 2)) {
                pcVar21 = z->resample_row_hv_2_kernel;
              }
              else {
                pcVar21 = stbi__resample_row_generic;
              }
              *(code **)((long)local_f8 + lVar18) = pcVar21;
            }
          }
          if (pvVar20 == (void *)0x0) goto LAB_0013b0c1;
          lVar18 = lVar18 + 0x30;
        } while ((ulong)uVar43 * 0x30 != lVar18);
        psVar37 = z->s;
        sVar14 = psVar37->img_y;
        pvVar22 = stbi__malloc_mad3(req_comp,psVar37->img_x,sVar14,1);
        if (pvVar22 != (void *)0x0) {
          iVar13 = why_00;
          if (sVar14 != 0) {
            iVar17 = 0;
            uVar25 = 0;
            do {
              sVar14 = psVar37->img_x;
              ppsVar34 = local_158;
              lVar18 = 0;
              do {
                puVar23 = (undefined8 *)((long)local_f0 + lVar18 + 8);
                iVar13 = *(int *)((long)local_e0 + lVar18 + 0xc);
                iVar44 = *(int *)((long)local_e0 + lVar18 + 4);
                iVar24 = iVar44 >> 1;
                puVar28 = puVar23;
                if (iVar13 < iVar24) {
                  puVar28 = (undefined8 *)((long)local_f0 + lVar18);
                }
                if (iVar24 <= iVar13) {
                  puVar23 = (undefined8 *)((long)local_f0 + lVar18);
                }
                auVar48 = (**(code **)((long)local_f8 + lVar18))
                                    (*(undefined8 *)((long)&z->img_comp[0].linebuf + lVar18 * 2),
                                     *puVar28,*puVar23,*(undefined4 *)((long)local_e0 + lVar18 + 8))
                ;
                psVar33 = auVar48._8_8_;
                *ppsVar34 = auVar48._0_8_;
                *(int *)((long)local_e0 + lVar18 + 0xc) = iVar13 + 1;
                if (iVar44 <= iVar13 + 1) {
                  *(undefined4 *)((long)local_e0 + lVar18 + 0xc) = 0;
                  lVar27 = *(long *)((long)local_f0 + lVar18 + 8);
                  *(long *)((long)local_f0 + lVar18) = lVar27;
                  iVar13 = *(int *)((long)local_e0 + lVar18 + 0x10) + 1;
                  *(int *)((long)local_e0 + lVar18 + 0x10) = iVar13;
                  if (iVar13 < *(int *)((long)&z->img_comp[0].y + lVar18 * 2)) {
                    *(long *)((long)local_f0 + lVar18 + 8) =
                         lVar27 + *(int *)((long)&z->img_comp[0].w2 + lVar18 * 2);
                  }
                }
                lVar18 = lVar18 + 0x30;
                ppsVar34 = ppsVar34 + 1;
              } while ((ulong)uVar43 * 0x30 != lVar18);
              if (req_comp < 3) {
                psVar37 = z->s;
                if (bVar47) {
                  if (req_comp == 1) {
                    if (psVar37->img_x != 0) {
                      uVar42 = 0;
                      do {
                        bVar10 = local_158[2][uVar42];
                        *(char *)((long)pvVar22 + uVar42 + sVar14 * iVar17) =
                             (char)((uint)bVar10 * 2 + ((uint)bVar10 + (uint)bVar10 * 8) * 3 +
                                    (uint)local_158[1][uVar42] * 0x96 +
                                    (uint)local_158[0][uVar42] * 0x4d >> 8);
                        uVar42 = uVar42 + 1;
                        psVar33 = local_158[1];
                      } while (uVar42 < psVar37->img_x);
                    }
                  }
                  else if (psVar37->img_x != 0) {
                    uVar42 = 0;
                    do {
                      bVar10 = local_158[2][uVar42];
                      *(char *)((long)pvVar22 + uVar42 * 2 + (ulong)(sVar14 * iVar17)) =
                           (char)((uint)bVar10 * 2 + ((uint)bVar10 + (uint)bVar10 * 8) * 3 +
                                  (uint)local_158[1][uVar42] * 0x96 +
                                  (uint)local_158[0][uVar42] * 0x4d >> 8);
                      *(undefined1 *)((long)pvVar22 + uVar42 * 2 + (ulong)(sVar14 * iVar17) + 1) =
                           0xff;
                      uVar42 = uVar42 + 1;
                      psVar33 = local_158[1];
                    } while (uVar42 < psVar37->img_x);
                  }
                }
                else if (psVar37->img_n == 4) {
                  if (z->app14_color_transform == 2) {
                    if (psVar37->img_x != 0) {
                      puVar35 = (undefined1 *)((long)pvVar22 + (ulong)(sVar14 * iVar17) + 1);
                      uVar42 = 0;
                      do {
                        iVar13 = (local_158[0][uVar42] ^ 0xff) * (uint)local_158[3][uVar42];
                        puVar35[-1] = (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                        *puVar35 = 0xff;
                        uVar42 = uVar42 + 1;
                        puVar35 = puVar35 + (uint)req_comp;
                        psVar33 = local_158[3];
                      } while (uVar42 < psVar37->img_x);
                    }
                  }
                  else {
                    if (z->app14_color_transform != 0) goto LAB_0013add4;
                    if (psVar37->img_x != 0) {
                      puVar35 = (undefined1 *)((long)pvVar22 + (ulong)(sVar14 * iVar17) + 1);
                      uVar42 = 0;
                      do {
                        bVar10 = local_158[3][uVar42];
                        iVar13 = (uint)local_158[0][uVar42] * (uint)bVar10;
                        iVar44 = (uint)local_158[1][uVar42] * (uint)bVar10;
                        puVar35[-1] = (char)(((uint)local_158[2][uVar42] * (uint)bVar10 +
                                              ((uint)local_158[2][uVar42] * (uint)bVar10 + 0x80 >> 8
                                              ) + 0x80 >> 8 & 0xff) * 0x1d +
                                             (iVar44 + (iVar44 + 0x80U >> 8) + 0x80 >> 8 & 0xff) *
                                             0x96 + (iVar13 + (iVar13 + 0x80U >> 8) + 0x80 >> 8 &
                                                    0xff) * 0x4d >> 8);
                        *puVar35 = 0xff;
                        uVar42 = uVar42 + 1;
                        puVar35 = puVar35 + (uint)req_comp;
                        psVar33 = local_158[0];
                      } while (uVar42 < psVar37->img_x);
                    }
                  }
                }
                else {
LAB_0013add4:
                  uVar29 = psVar37->img_x;
                  psVar33 = (stbi_uc *)(ulong)uVar29;
                  if (req_comp == 1) {
                    if (uVar29 != 0) {
                      psVar33 = (stbi_uc *)0x0;
                      do {
                        psVar33[(ulong)(sVar14 * iVar17) + (long)pvVar22] =
                             local_158[0][(long)psVar33];
                        psVar33 = psVar33 + 1;
                      } while (psVar33 < (stbi_uc *)(ulong)psVar37->img_x);
                    }
                  }
                  else if (uVar29 != 0) {
                    psVar33 = (stbi_uc *)0x0;
                    do {
                      *(stbi_uc *)((long)pvVar22 + (long)psVar33 * 2 + (ulong)(sVar14 * iVar17)) =
                           local_158[0][(long)psVar33];
                      *(undefined1 *)
                       ((long)pvVar22 + (long)psVar33 * 2 + (ulong)(sVar14 * iVar17) + 1) = 0xff;
                      psVar33 = psVar33 + 1;
                    } while (psVar33 < (stbi_uc *)(ulong)psVar37->img_x);
                  }
                }
              }
              else {
                psVar40 = (stbi_uc *)((ulong)(uVar25 * req_comp * sVar14) + (long)pvVar22);
                psVar37 = z->s;
                if (psVar37->img_n == 3) {
                  if (bVar47) {
                    if (psVar37->img_x != 0) {
                      puVar35 = (undefined1 *)((long)pvVar22 + (ulong)(sVar14 * iVar17) + 3);
                      uVar42 = 0;
                      do {
                        puVar35[-3] = local_158[0][uVar42];
                        puVar35[-2] = local_158[1][uVar42];
                        puVar35[-1] = local_158[2][uVar42];
                        *puVar35 = 0xff;
                        uVar42 = uVar42 + 1;
                        puVar35 = puVar35 + (uint)req_comp;
                        psVar33 = local_158[2];
                      } while (uVar42 < psVar37->img_x);
                    }
                  }
                  else {
LAB_0013ae49:
                    (*z->YCbCr_to_RGB_kernel)
                              (psVar40,local_158[0],local_158[1],local_158[2],psVar37->img_x,
                               req_comp);
                    psVar33 = extraout_RDX_15;
                  }
                }
                else if (psVar37->img_n == 4) {
                  if (z->app14_color_transform == 2) {
                    (*z->YCbCr_to_RGB_kernel)
                              (psVar40,local_158[0],local_158[1],local_158[2],psVar37->img_x,
                               req_comp);
                    psVar37 = z->s;
                    psVar33 = extraout_RDX_16;
                    if (psVar37->img_x != 0) {
                      pbVar36 = (byte *)((long)pvVar22 + (ulong)(sVar14 * iVar17) + 2);
                      psVar33 = (stbi_uc *)0x0;
                      do {
                        bVar10 = local_158[3][(long)psVar33];
                        iVar13 = (pbVar36[-2] ^ 0xff) * (uint)bVar10;
                        pbVar36[-2] = (byte)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                        iVar13 = (pbVar36[-1] ^ 0xff) * (uint)bVar10;
                        pbVar36[-1] = (byte)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                        iVar13 = (*pbVar36 ^ 0xff) * (uint)bVar10;
                        *pbVar36 = (byte)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                        psVar33 = psVar33 + 1;
                        pbVar36 = pbVar36 + (uint)req_comp;
                      } while (psVar33 < (stbi_uc *)(ulong)psVar37->img_x);
                    }
                  }
                  else {
                    if (z->app14_color_transform != 0) goto LAB_0013ae49;
                    if (psVar37->img_x != 0) {
                      puVar35 = (undefined1 *)((long)pvVar22 + (ulong)(sVar14 * iVar17) + 3);
                      uVar42 = 0;
                      do {
                        bVar10 = local_158[3][uVar42];
                        iVar13 = (uint)local_158[0][uVar42] * (uint)bVar10;
                        puVar35[-3] = (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                        iVar13 = (uint)local_158[1][uVar42] * (uint)bVar10;
                        puVar35[-2] = (char)((iVar13 + 0x80U >> 8) + iVar13 + 0x80 >> 8);
                        puVar35[-1] = (char)(((uint)local_158[2][uVar42] * (uint)bVar10 + 0x80 >> 8)
                                             + (uint)local_158[2][uVar42] * (uint)bVar10 + 0x80 >> 8
                                            );
                        *puVar35 = 0xff;
                        uVar42 = uVar42 + 1;
                        puVar35 = puVar35 + (uint)req_comp;
                        psVar33 = local_158[1];
                      } while (uVar42 < psVar37->img_x);
                    }
                  }
                }
                else if (psVar37->img_x != 0) {
                  puVar35 = (undefined1 *)((long)pvVar22 + (ulong)(sVar14 * iVar17) + 3);
                  psVar40 = (stbi_uc *)0x0;
                  do {
                    sVar3 = local_158[0][(long)psVar40];
                    puVar35[-1] = sVar3;
                    puVar35[-2] = sVar3;
                    puVar35[-3] = sVar3;
                    *puVar35 = 0xff;
                    psVar40 = psVar40 + 1;
                    psVar33 = (stbi_uc *)(ulong)psVar37->img_x;
                    puVar35 = puVar35 + (uint)req_comp;
                  } while (psVar40 < psVar33);
                }
              }
              iVar13 = (int)psVar33;
              uVar25 = uVar25 + 1;
              psVar37 = z->s;
              iVar17 = iVar17 + req_comp;
            } while (uVar25 < psVar37->img_y);
          }
          stbi__free_jpeg_components(z,psVar37->img_n,iVar13);
          psVar37 = z->s;
          *local_100 = psVar37->img_x;
          *local_118 = psVar37->img_y;
          if (local_110 != (int *)0x0) {
            *local_110 = (uint)(2 < psVar37->img_n) * 2 + 1;
          }
          goto LAB_0013b0c1;
        }
        stbi__free_jpeg_components(z,psVar37->img_n,why_00);
        *puVar23 = "outofmem";
        goto LAB_0013b0be;
      }
    }
    stbi__free_jpeg_components(z,uVar29,uVar25);
  }
  else {
    *(char **)(*in_FS_OFFSET + -0x20) = "bad req_comp";
  }
LAB_0013b0be:
  pvVar22 = (void *)0x0;
LAB_0013b0c1:
  free(z);
  return pvVar22;
LAB_0013a536:
  iVar15 = 0;
LAB_0013a553:
  if (iVar15 == 0) goto LAB_0013b0af;
  paVar32 = paVar1;
  if (z->marker == 0xff) {
    do {
      psVar37 = z->s;
      if ((psVar37->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0013a589:
        if (psVar37->img_buffer_end <= psVar37->img_buffer) {
LAB_0013a66b:
          uVar11 = 0xff;
          break;
        }
      }
      else {
        iVar13 = (*(psVar37->io).eof)(psVar37->io_user_data);
        if (iVar13 != 0) {
          if (psVar37->read_from_callbacks != 0) goto LAB_0013a589;
          goto LAB_0013a66b;
        }
      }
      psVar37 = z->s;
      pbVar36 = psVar37->img_buffer;
      if (pbVar36 < psVar37->img_buffer_end) {
LAB_0013a5cb:
        psVar37->img_buffer = pbVar36 + 1;
        paVar19 = (anon_struct_96_18_0d0905d3 *)(ulong)*pbVar36;
      }
      else {
        if (psVar37->read_from_callbacks != 0) {
          stbi__refill_buffer(psVar37);
          pbVar36 = psVar37->img_buffer;
          goto LAB_0013a5cb;
        }
        paVar19 = (anon_struct_96_18_0d0905d3 *)0x0;
      }
      do {
        cVar6 = (char)paVar19;
        if (cVar6 != -1) {
          paVar19 = (anon_struct_96_18_0d0905d3 *)((ulong)paVar32 & 0xffffffff);
          break;
        }
        psVar37 = z->s;
        if ((psVar37->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0013a5fb:
          if (psVar37->img_buffer_end <= psVar37->img_buffer) {
LAB_0013a650:
            paVar19 = (anon_struct_96_18_0d0905d3 *)0xff;
            break;
          }
        }
        else {
          iVar13 = (*(psVar37->io).eof)(psVar37->io_user_data);
          if (iVar13 != 0) {
            if (psVar37->read_from_callbacks != 0) goto LAB_0013a5fb;
            goto LAB_0013a650;
          }
        }
        psVar37 = z->s;
        pbVar36 = psVar37->img_buffer;
        if (pbVar36 < psVar37->img_buffer_end) {
LAB_0013a635:
          psVar37->img_buffer = pbVar36 + 1;
          paVar19 = (anon_struct_96_18_0d0905d3 *)(ulong)*pbVar36;
        }
        else {
          if (psVar37->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar37);
            pbVar36 = psVar37->img_buffer;
            goto LAB_0013a635;
          }
          paVar19 = (anon_struct_96_18_0d0905d3 *)0x0;
        }
      } while (0xfd < (byte)((char)paVar19 - 1U));
      uVar11 = (uchar)paVar19;
      paVar32 = paVar19;
    } while (cVar6 != -1);
    z->marker = uVar11;
  }
  bVar10 = stbi__get_marker(z);
  uVar29 = (uint)bVar10;
  uVar31 = extraout_RDX_13;
  if ((bVar10 & 0xf8) == 0xd0) {
LAB_001391a8:
    bVar10 = stbi__get_marker(z);
    uVar29 = (uint)bVar10;
    uVar31 = extraout_RDX_00;
  }
  goto LAB_00139176;
LAB_001391b6:
  iVar13 = stbi__get16be(z->s);
  sVar14 = stbi__get16be(z->s);
  uVar31 = extraout_RDX_01;
  if (iVar13 == 4) {
    if (sVar14 == z->s->img_y) {
      bVar10 = stbi__get_marker(z);
      uVar29 = (uint)bVar10;
      bVar47 = true;
      uVar31 = extraout_RDX_02;
    }
    else {
      *puVar23 = "bad DNL height";
      uVar29 = 0xdc;
      bVar47 = false;
    }
  }
  else {
    *puVar23 = "bad DNL len";
    uVar29 = 0xdc;
    bVar47 = false;
  }
  uVar25 = (uint)uVar31;
  if (!bVar47) goto LAB_0013b0af;
  goto LAB_00139176;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__errpuc("outofmem", "Out of memory");
   memset(j, 0, sizeof(stbi__jpeg));
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}